

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

string * __thiscall IPAddress::GetString_abi_cxx11_(string *__return_storage_ptr__,IPAddress *this)

{
  uint uVar1;
  char buf [16];
  allocator<char> local_29;
  char local_28 [24];
  
  uVar1 = this->address;
  sprintf(local_28,"%u.%u.%u.%u",(ulong)(uVar1 >> 0x18),(ulong)(uVar1 >> 0x10 & 0xff),
          (ulong)(uVar1 >> 8 & 0xff),(ulong)(uVar1 & 0xff));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_28,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string IPAddress::GetString() const
{
	char buf[16];
	unsigned char o1, o2, o3, o4;
	o1 = (this->address & 0xFF000000) >> 24;
	o2 = (this->address & 0x00FF0000) >> 16;
	o3 = (this->address & 0x0000FF00) >> 8;
	o4 = this->address & 0x000000FF;
	std::sprintf(buf, "%u.%u.%u.%u", o1, o2, o3, o4);
	return std::string(buf);
}